

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

bool __thiscall LinearScan::RemoveDeadStores(LinearScan *this,Instr *instr)

{
  Opnd *this_00;
  bool bVar1;
  RegOpnd *pRVar2;
  
  this_00 = instr->m_dst;
  if ((((this_00 != (Opnd *)0x0) && (bVar1 = IR::Opnd::IsRegOpnd(this_00), bVar1)) &&
      (pRVar2 = IR::Opnd::AsRegOpnd(this_00), pRVar2->m_sym != (StackSym *)0x0)) &&
     (((pRVar2 = IR::Opnd::AsRegOpnd(this_00), (pRVar2->field_0x18 & 2) == 0 &&
       (pRVar2 = IR::Opnd::AsRegOpnd(this_00),
       (*(byte *)((long)pRVar2->m_sym->scratch + 0x9c) & 8) != 0)) &&
      (bVar1 = Lowerer::HasSideEffects(instr), !bVar1)))) {
    this->func->allowRemoveBailOutArgInstr = true;
    EndDeadLifetimes(this,instr,false);
    IR::Instr::Remove(instr);
    this->func->allowRemoveBailOutArgInstr = false;
    return true;
  }
  return false;
}

Assistant:

bool
LinearScan::RemoveDeadStores(IR::Instr *instr)
{
    IR::Opnd *dst = instr->GetDst();

    if (dst && dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym && !dst->AsRegOpnd()->m_isCallArg)
    {
        IR::RegOpnd *regOpnd = dst->AsRegOpnd();
        Lifetime * lifetime = regOpnd->m_sym->scratch.linearScan.lifetime;

        if (lifetime->isDeadStore)
        {
            if (Lowerer::HasSideEffects(instr) == false)
            {
                // If all the bailouts referencing this arg are removed (which can happen in some scenarios)
                //- then it's OK to remove this def of the arg
                DebugOnly(this->func->allowRemoveBailOutArgInstr = true);

                // We are removing this instruction, end dead life time now
                this->EndDeadLifetimes(instr, false);
                instr->Remove();

                DebugOnly(this->func->allowRemoveBailOutArgInstr = false);
                return true;
            }
        }
    }

    return false;
}